

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cxx
# Opt level: O2

int main(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  system_error *this;
  int *piVar3;
  error_category *__ecat;
  long lVar4;
  allocator local_4b9;
  array<int,_2UL> signals;
  seconds oneSecond;
  OledI2C oled;
  
  signals._M_elems[0] = 2;
  signals._M_elems[1] = 0xf;
  lVar4 = 0;
  do {
    if (lVar4 == 8) {
      std::__cxx11::string::string((string *)&oneSecond,"/dev/i2c-1",&local_4b9);
      SSD1306::OledI2C::OledI2C(&oled,(string *)&oneSecond,'<');
      std::__cxx11::string::~string((string *)&oneSecond);
      while ((anonymous_namespace)::run != 0) {
        showTime(&oled);
        oneSecond.__r = 1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&oneSecond);
      }
      SSD1306::OledI2C::clear(&oled);
      SSD1306::OledI2C::displayUpdate(&oled);
      SSD1306::OledI2C::~OledI2C(&oled);
      return 0;
    }
    iVar1 = *(int *)((long)signals._M_elems + lVar4);
    p_Var2 = signal(iVar1,signalHandler);
    lVar4 = lVar4 + 4;
  } while (p_Var2 != (__sighandler_t)0xffffffffffffffff);
  std::__cxx11::string::string((string *)&oled,"installing ",(allocator *)&oneSecond);
  strsignal(iVar1);
  std::__cxx11::string::append((char *)&oled);
  std::__cxx11::string::append((char *)&oled);
  this = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this,iVar1,__ecat,(string *)&oled);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        while (run)
        {
            showTime(oled);

            constexpr auto oneSecond(std::chrono::seconds(1));
            std::this_thread::sleep_for(oneSecond);
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}